

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O3

void __thiscall Fl_GTK_File_Chooser::~Fl_GTK_File_Chooser(Fl_GTK_File_Chooser *this)

{
  GSList *iter;
  undefined8 *puVar1;
  
  (this->super_Fl_FLTK_File_Chooser)._vptr_Fl_FLTK_File_Chooser =
       (_func_int **)&PTR__Fl_GTK_File_Chooser_00278a30;
  if (this->gtkw_ptr != (GtkWidget *)0x0) {
    (*fl_gtk_widget_destroy)(this->gtkw_ptr);
    this->gtkw_ptr = (GtkWidget *)0x0;
  }
  if (this->gtkw_filename != (char *)0x0) {
    (*fl_g_free)(this->gtkw_filename);
    this->gtkw_filename = (char *)0x0;
  }
  puVar1 = (undefined8 *)this->gtkw_slist;
  if (puVar1 != (undefined8 *)0x0) {
    do {
      if ((gpointer)*puVar1 != (gpointer)0x0) {
        (*fl_g_free)((gpointer)*puVar1);
      }
      puVar1 = (undefined8 *)puVar1[1];
    } while (puVar1 != (undefined8 *)0x0);
    (*fl_g_slist_free)((GSList *)this->gtkw_slist);
    this->gtkw_slist = (void *)0x0;
  }
  this->gtkw_count = 0;
  if (this->gtkw_title != (char *)0x0) {
    operator_delete__(this->gtkw_title);
  }
  this->gtkw_title = (char *)0x0;
  Fl_FLTK_File_Chooser::~Fl_FLTK_File_Chooser(&this->super_Fl_FLTK_File_Chooser);
  return;
}

Assistant:

Fl_GTK_File_Chooser::~Fl_GTK_File_Chooser()
{
  // Should free up resources taken for...
  if(gtkw_ptr) { 
    fl_gtk_widget_destroy (gtkw_ptr);
    gtkw_ptr = NULL;
  }
  if(gtkw_filename) {
    fl_g_free(gtkw_filename);
    gtkw_filename = NULL;
  }
  if(gtkw_slist) {
    GSList *iter = (GSList *)gtkw_slist;
    while(iter) {
      if(iter->data) fl_g_free(iter->data);
      iter = g_slist_next(iter);
    }
    fl_g_slist_free((GSList *)gtkw_slist);
    gtkw_slist = NULL;
  }
  gtkw_count = 0; // assume we have no files selected now
  gtkw_title = strfree(gtkw_title);
}